

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
mpt::unique_array<mpt::metatype_*>::unique_array(unique_array<mpt::metatype_*> *this,long len)

{
  int iVar1;
  type_traits *traits;
  undefined4 extraout_var;
  content<mpt::metatype_*> *local_50;
  content<mpt::metatype_*> *local_30;
  content<mpt::metatype_*> *data;
  long len_local;
  unique_array<mpt::metatype_*> *this_local;
  
  reference<mpt::content<mpt::metatype_*>_>::reference(&this->_ref,(content<mpt::metatype_*> *)0x0);
  if (unique_array<mpt::metatype*>::unique_array(long)::_dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&unique_array<mpt::metatype*>::unique_array(long)::_dummy);
    if (iVar1 != 0) {
      traits = type_properties<mpt::metatype_*>::traits();
      default_data::default_data(&unique_array::_dummy,traits);
      __cxa_atexit(default_data::~default_data,&unique_array::_dummy,&__dso_handle);
      __cxa_guard_release(&unique_array<mpt::metatype*>::unique_array(long)::_dummy);
    }
  }
  local_30 = &unique_array::_dummy.super_content<mpt::metatype_*>;
  if (-1 < len) {
    iVar1 = (*unique_array::_dummy.super_content<mpt::metatype_*>.super_buffer._vptr_buffer[3])
                      (&unique_array::_dummy,len << 3);
    local_30 = (content<mpt::metatype_*> *)CONCAT44(extraout_var,iVar1);
  }
  if (local_30 == (content<mpt::metatype_*> *)0x0) {
    local_50 = &unique_array::_dummy.super_content<mpt::metatype_*>;
  }
  else {
    local_50 = local_30;
  }
  reference<mpt::content<mpt::metatype_*>_>::set_instance(&this->_ref,local_50);
  return;
}

Assistant:

unique_array(long len = -1)
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		_ref.set_instance(data ? data : &_dummy);
	}